

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# state.c
# Opt level: O0

IceTVoid * icetGetStateBuffer(IceTEnum pname,IceTSizeType num_bytes)

{
  IceTEnum IVar1;
  IceTSizeType IVar2;
  void *pvVar3;
  IceTState state;
  IceTVoid *pIVar4;
  IceTVoid *buffer;
  IceTSizeType num_bytes_local;
  IceTEnum pname_local;
  
  IVar1 = icetStateGetType(pname);
  if ((IVar1 == 0x800f) && (IVar2 = icetStateGetNumEntries(pname), num_bytes <= IVar2)) {
    pvVar3 = icetUnsafeStateGet(pname,0x800f);
    return pvVar3;
  }
  IVar1 = icetStateGetType(pname);
  if ((IVar1 != 0x800f) && (IVar1 = icetStateGetType(pname), IVar1 != 0)) {
    icetRaiseDiagnostic("A non-buffer state variable is being reallocated as a state variable.  This is probably indicative of mixing up state variables."
                        ,0xffffffff,3,
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/kmorel[P]IceT/src/ice-t/state.c"
                        ,0x2ab);
  }
  state = icetGetState();
  pIVar4 = stateAllocate(pname,num_bytes,0x800f,state);
  return pIVar4;
}

Assistant:

IceTVoid *icetGetStateBuffer(IceTEnum pname, IceTSizeType num_bytes)
{
    if (   (icetStateGetType(pname) == ICET_VOID)
        && (icetStateGetNumEntries(pname) >= num_bytes) ) {
      /* A big enough buffer is already allocated. */
        IceTVoid *buffer = icetUnsafeStateGet(pname, ICET_VOID);
#ifdef ICET_STATE_CHECK_MEM
        memset(buffer, 0xDC, num_bytes);
#endif
        return buffer;
    }

  /* Check to make sure this state variable has not been used for anything
   * besides a buffer. */
    if (   (icetStateGetType(pname) != ICET_VOID)
        && (icetStateGetType(pname) != ICET_NULL) ) {
        icetRaiseWarning("A non-buffer state variable is being reallocated as"
                         " a state variable.  This is probably indicative of"
                         " mixing up state variables.",
                         ICET_SANITY_CHECK_FAIL);
    }

    return stateAllocate(pname, num_bytes, ICET_VOID, icetGetState());
}